

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

bool anon_unknown.dwarf_8b17::SolverDpllTriadSimd<1>::BandEliminate<1>
               (State *state,int band_idx,int from_peer)

{
  Box *pBVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  long lVar7;
  Cells16 *candidates;
  Cells16 *candidates_00;
  Cells16 *candidates_01;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  Cells08 peer_triads [3];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  lVar7 = (long)band_idx;
  auVar2 = *(undefined1 (*) [16])state->boxen[lVar7 + -3].cells.vec;
  auVar9 = *(undefined1 (*) [16])(state->boxen[lVar7 + -3].cells.vec + 2);
  if ((auVar9 & auVar2) == (undefined1  [16])0x0) {
    return true;
  }
  pBVar1 = state->boxen + lVar7 + -3;
  auVar2 = vpandn_avx(auVar9,auVar2);
  auVar17._8_2_ = 3;
  auVar17._0_8_ = 0x3000300030003;
  auVar17._10_2_ = 3;
  auVar17._12_2_ = 3;
  auVar17._14_2_ = 3;
  auVar17._16_2_ = 3;
  auVar17._18_2_ = 3;
  auVar17._20_2_ = 3;
  auVar17._22_2_ = 3;
  auVar17._24_2_ = 3;
  auVar17._26_2_ = 3;
  auVar17._28_2_ = 3;
  auVar17._30_2_ = 3;
  lVar8 = (long)from_peer;
  auVar16._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
  auVar16._16_16_ = ZEXT116(1) * auVar2;
  *(undefined1 (*) [16])(pBVar1->cells).vec = auVar2;
  lVar7 = lVar7 * 0xc;
  auVar10 = vpshufb_avx2(auVar16,(anonymous_namespace)::tables._5824_32_);
  auVar11 = vpshufb_avx2(auVar16,(anonymous_namespace)::tables._5856_32_);
  auVar11 = vpor_avx2(auVar11,auVar10);
  auVar10 = vpopcntw_avx512_bitalg(auVar11);
  auVar10 = vpcmpeqw_avx2(auVar10,auVar17);
  auVar10 = vpand_avx2(auVar10,auVar11);
  auVar15 = auVar10._0_16_;
  auVar9 = vpshufb_avx(auVar15,(anonymous_namespace)::tables._4864_16_);
  auVar5 = vpshufd_avx(auVar15,0x4e);
  auVar4 = vpshufb_avx(auVar5,(anonymous_namespace)::tables._4848_16_);
  auVar5 = vpshufb_avx(auVar5,(anonymous_namespace)::tables._4896_16_);
  auVar9 = vpternlogd_avx512vl(auVar9,auVar4,auVar5,0xfe);
  auVar2 = vpandn_avx(auVar9,auVar2);
  *(undefined1 (*) [16])(pBVar1->cells).vec = auVar2;
  auVar9 = vpshufb_avx(auVar15,(anonymous_namespace)::tables._4912_16_);
  auVar5 = vpshufd_avx(auVar10._16_16_,0x4e);
  auVar4 = vpshufb_avx(auVar5,(anonymous_namespace)::tables._4880_16_);
  auVar5 = vpshufb_avx(auVar5,(anonymous_namespace)::tables._4928_16_);
  auVar9 = vpternlogd_avx512vl(auVar5,auVar9,auVar4,0xfe);
  auVar2 = vpandn_avx(auVar9,auVar2);
  *(undefined1 (*) [16])(pBVar1->cells).vec = auVar2;
  auVar11._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
  auVar11._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar10 = vpshufb_avx2(auVar11,(anonymous_namespace)::tables._5824_32_);
  auVar11 = vpshufb_avx2(auVar11,(anonymous_namespace)::tables._5856_32_);
  iVar3 = *(int *)((anonymous_namespace)::tables + lVar8 * 4 + 0x18e4);
  candidates = (Cells16 *)
               ((long)*(int *)((anonymous_namespace)::tables + lVar8 * 4 + 0x18e0) * 0x10);
  auVar10 = vpor_avx2(auVar11,auVar10);
  local_48 = vpshufd_avx(auVar10._0_16_,0x4e);
  local_58 = auVar10._0_16_;
  local_38 = auVar10._16_16_;
  auVar2 = vpor_avx(*(undefined1 (*) [16])(local_58 + (long)candidates),_DAT_0010aaf0);
  auVar12._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar10 = vpshufb_avx2(auVar12,(anonymous_namespace)::tables._5952_32_);
  auVar11 = vpshufb_avx2(auVar12,(anonymous_namespace)::tables._5984_32_);
  vpor_avx2(auVar11,auVar10);
  bVar6 = BoxRestrict<1>(state,*(int *)(lVar7 + 0x1117f4 +
                                       (long)*(int *)((anonymous_namespace)::tables +
                                                     lVar8 * 4 + 0x18e0) * 4),candidates);
  if (bVar6) {
    auVar2 = vpor_avx(*(undefined1 (*) [16])(local_58 + (long)iVar3 * 0x10),_DAT_0010aaf0);
    auVar13._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
    auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    auVar10 = vpshufb_avx2(auVar13,(anonymous_namespace)::tables._5952_32_);
    auVar11 = vpshufb_avx2(auVar13,(anonymous_namespace)::tables._5984_32_);
    vpor_avx2(auVar11,auVar10);
    bVar6 = BoxRestrict<1>(state,*(int *)(lVar7 + 0x1117f4 + (long)iVar3 * 4),candidates_00);
    if (bVar6) {
      auVar2 = vpor_avx(*(undefined1 (*) [16])(local_58 + lVar8 * 0x10),_DAT_0010aaf0);
      auVar14._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar2;
      auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      auVar10 = vpshufb_avx2(auVar14,(anonymous_namespace)::tables._5952_32_);
      auVar11 = vpshufb_avx2(auVar14,(anonymous_namespace)::tables._5984_32_);
      vpor_avx2(auVar11,auVar10);
      bVar6 = BoxRestrict<1>(state,*(int *)(lVar7 + 0x1117f4 + lVar8 * 4),candidates_01);
      return bVar6;
    }
  }
  return false;
}

Assistant:

static bool BandEliminate(State &state, int band_idx, int from_peer = 0) {
        Band &band = state.bands[vertical][band_idx];
        if (LIKELY(!band.configurations.Intersects(band.eliminations))) return true;
        // after eliminating we might check that every value is still consistent with some
        // configuration, but the check is a net loss.
        band.configurations = band.configurations.and_not(band.eliminations);

        Cells16 triads = ConfigurationsToPositiveTriads(band.configurations);
        // we might check here that every cell (corresponding to a minirow or minicol) still has
        // at least three triad candidates, but the check is a net loss.
        Cells16 counts = triads.Popcounts9();

        // we might repeat the updating of triads below until we no longer trigger new triad 3/
        // clauses. however, just once delivers most of the benefit, and it's best not to branch.
        Cells16 asserting = triads & counts.WhichEqual(Cells16::All(3));
        Cells08 lo = asserting.GetLo();
        Cells08 hi = asserting.GetHi();
        band.configurations = band.configurations.and_not(Cells08::X_Y_or_Z_or(
                lo.RotateCols().Shuffle(tables.triads_shift1_to_config_elims[0]),
                lo.RotateCols().Shuffle(tables.triads_shift2_to_config_elims[0]),
                lo.Shuffle(tables.triads_shift1_to_config_elims[1])));
        band.configurations = band.configurations.and_not(Cells08::X_Y_or_Z_or(
                lo.Shuffle(tables.triads_shift2_to_config_elims[1]),
                hi.RotateCols().Shuffle(tables.triads_shift1_to_config_elims[2]),
                hi.RotateCols().Shuffle(tables.triads_shift2_to_config_elims[2])));
        triads = ConfigurationsToPositiveTriads(band.configurations);

        // convert positive triads to box restriction messages and send to the three box peers.
        // send these messages in order so that we return to the inbound peer last.
        int peer[3]{tables.mod3[from_peer + 1], tables.mod3[from_peer + 2], from_peer};
        auto &box_peers = tables.box_peers[vertical][band_idx];
        Cells08 peer_triads[3]{ triads.GetLo(), triads.GetLo().RotateCols(), triads.GetHi() };
        return (BoxRestrict<vertical>(state, box_peers[peer[0]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[0]], vertical)) &&
                BoxRestrict<vertical>(state, box_peers[peer[1]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[1]], vertical)) &&
                BoxRestrict<vertical>(state, box_peers[peer[2]],
                        PositiveTriadsToBoxCandidates(peer_triads[peer[2]], vertical)));
    }